

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

int ON_4dPoint::ProjectiveCompare(ON_4dPoint *lhs,ON_4dPoint *rhs)

{
  ON_3dPoint local_50;
  ON_3dPoint local_38;
  ON_4dPoint *local_20;
  ON_4dPoint *rhs_local;
  ON_4dPoint *lhs_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  if ((lhs->w != rhs->w) || (NAN(lhs->w) || NAN(rhs->w))) {
    if (((lhs->w == 0.0) && (!NAN(lhs->w))) || ((rhs->w == 0.0 && (!NAN(rhs->w))))) {
      if ((((lhs->w == 0.0) && (!NAN(lhs->w))) || (rhs->w != 0.0)) || (NAN(rhs->w))) {
        if (((lhs->w != 0.0) || (NAN(lhs->w))) || ((rhs->w == 0.0 && (!NAN(rhs->w))))) {
          if ((lhs->w != lhs->w) || (NAN(lhs->w) || NAN(lhs->w))) {
            if ((rhs->w != rhs->w) || (NAN(rhs->w) || NAN(rhs->w))) {
              lhs_local._4_4_ = Internal_DoubleArrayCompare(3,&lhs->x,&rhs->x);
            }
            else {
              lhs_local._4_4_ = 1;
            }
          }
          else {
            lhs_local._4_4_ = -1;
          }
        }
        else {
          lhs_local._4_4_ = 1;
        }
      }
      else {
        lhs_local._4_4_ = -1;
      }
    }
    else {
      ON_3dPoint::ON_3dPoint(&local_38,lhs);
      ON_3dPoint::ON_3dPoint(&local_50,local_20);
      lhs_local._4_4_ = ON_3dPoint::Compare(&local_38,&local_50);
    }
  }
  else {
    lhs_local._4_4_ = Internal_DoubleArrayCompare(3,&lhs->x,&rhs->x);
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_4dPoint::ProjectiveCompare(
  const ON_4dPoint& lhs,
  const ON_4dPoint& rhs
  )
{
  if (lhs.w == rhs.w)
  {
    // neither lhs.w nor rhs.w is a nan
    return Internal_DoubleArrayCompare(3, &lhs.x, &rhs.x);
  }

  if (0.0 != lhs.w && 0.0 != rhs.w)
  {
    // neither lhs.w nor rhs.w is a nan
    return ON_3dPoint::Compare(ON_3dPoint(lhs), ON_3dPoint(rhs));
  }

  if (0.0 != lhs.w && 0.0 == rhs.w)
  {
    // neither lhs.w nor rhs.w is a nan
    return -1;
  }

  if (0.0 == lhs.w && 0.0 != rhs.w)
  {
    // neither lhs.w nor rhs.w is a nan
    return 1;
  }

  if (lhs.w == lhs.w)
  {
    // rhs.w is a nan
    return -1; 
  }

  if (rhs.w == rhs.w)
  {
    // lhs.w is a nan
    return 1; 
  }

  // lhs.w and rhs.w are both nans
  return Internal_DoubleArrayCompare(3, &lhs.x, &rhs.x);
}